

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

void FollowPath(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,unsigned_short *path,
               size_t pathsize,ZopfliLZ77Store *store,ZopfliHash *h)

{
  ZopfliHash *in_RCX;
  ZopfliHash *in_RDX;
  uchar *in_RSI;
  size_t in_RDI;
  long in_R8;
  ulong in_R9;
  uchar *unaff_retaddr;
  ZopfliHash *in_stack_00000008;
  ZopfliHash *in_stack_00000010;
  ZopfliLZ77Store *in_stack_00000020;
  unsigned_short dist;
  unsigned_short dummy_length;
  unsigned_short *in_stack_00000028;
  unsigned_short length;
  size_t total_length_test;
  size_t windowstart;
  size_t pos;
  size_t j;
  size_t i;
  ZopfliHash *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  uchar *in_stack_ffffffffffffff90;
  ZopfliHash *h_00;
  undefined2 in_stack_ffffffffffffffa0;
  unsigned_short in_stack_ffffffffffffffa2;
  undefined2 in_stack_ffffffffffffffa4;
  undefined2 in_stack_ffffffffffffffa6;
  ushort length_00;
  size_t pos_00;
  ZopfliHash *array;
  ZopfliHash *local_48;
  ulong local_40;
  ZopfliHash *local_38;
  ZopfliHash *limit;
  
  if (in_RDX < (ZopfliHash *)0x8001) {
    h_00 = (ZopfliHash *)0x0;
  }
  else {
    h_00 = (ZopfliHash *)&in_RDX[-0x1c8].same;
  }
  pos_00 = 0;
  if (in_RDX != in_RCX) {
    array = h_00;
    ZopfliResetHash(0x8000,in_stack_00000010);
    ZopfliWarmupHash(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78);
    local_48 = in_RDX;
    for (local_38 = array; local_38 < local_48; local_38 = (ZopfliHash *)((long)&local_38->head + 1)
        ) {
      ZopfliUpdateHash((uchar *)array,pos_00,
                       CONCAT26(in_stack_ffffffffffffffa6,
                                CONCAT24(in_stack_ffffffffffffffa4,
                                         CONCAT22(in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0))),h_00);
    }
    limit = local_48;
    for (local_38 = (ZopfliHash *)0x0; local_38 < in_R9;
        local_38 = (ZopfliHash *)((long)local_38 + 1)) {
      length_00 = *(ushort *)(in_R8 + (long)local_38 * 2);
      ZopfliUpdateHash((uchar *)array,pos_00,
                       CONCAT26(length_00,
                                CONCAT24(in_stack_ffffffffffffffa4,
                                         CONCAT22(in_stack_ffffffffffffffa2,
                                                  in_stack_ffffffffffffffa0))),h_00);
      if (length_00 < 3) {
        length_00 = 1;
        ZopfliStoreLitLenDist
                  (total_length_test._6_2_,total_length_test._4_2_,(size_t)in_stack_00000028,
                   in_stack_00000020);
        pos_00 = pos_00 + 1;
      }
      else {
        ZopfliFindLongestMatch
                  ((ZopfliBlockState *)in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,
                   (size_t)in_RSI,(size_t)limit,(unsigned_short *)in_stack_00000020,
                   in_stack_00000028,
                   (unsigned_short *)
                   CONCAT26(total_length_test._6_2_,
                            CONCAT24(total_length_test._4_2_,(undefined4)total_length_test)));
        ZopfliVerifyLenDist(in_RSI,(size_t)in_RCX,(size_t)local_48,in_stack_ffffffffffffffa2,
                            length_00);
        ZopfliStoreLitLenDist
                  (total_length_test._6_2_,total_length_test._4_2_,(size_t)in_stack_00000028,
                   in_stack_00000020);
        pos_00 = length_00 + pos_00;
      }
      for (local_40 = 1; local_40 < length_00; local_40 = local_40 + 1) {
        ZopfliUpdateHash((uchar *)array,pos_00,
                         CONCAT26(length_00,
                                  CONCAT24(in_stack_ffffffffffffffa4,
                                           CONCAT22(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0))),h_00);
      }
      local_48 = (ZopfliHash *)((long)&local_48->head + (ulong)length_00);
    }
  }
  return;
}

Assistant:

static void FollowPath(ZopfliBlockState* s,
                       const unsigned char* in, size_t instart, size_t inend,
                       unsigned short* path, size_t pathsize,
                       ZopfliLZ77Store* store, ZopfliHash *h) {
  size_t i, j, pos = 0;
  size_t windowstart = instart > ZOPFLI_WINDOW_SIZE
      ? instart - ZOPFLI_WINDOW_SIZE : 0;

  size_t total_length_test = 0;

  if (instart == inend) return;

  ZopfliResetHash(ZOPFLI_WINDOW_SIZE, h);
  ZopfliWarmupHash(in, windowstart, inend, h);
  for (i = windowstart; i < instart; i++) {
    ZopfliUpdateHash(in, i, inend, h);
  }

  pos = instart;
  for (i = 0; i < pathsize; i++) {
    unsigned short length = path[i];
    unsigned short dummy_length;
    unsigned short dist;
    assert(pos < inend);

    ZopfliUpdateHash(in, pos, inend, h);

    /* Add to output. */
    if (length >= ZOPFLI_MIN_MATCH) {
      /* Get the distance by recalculating longest match. The found length
      should match the length from the path. */
      ZopfliFindLongestMatch(s, h, in, pos, inend, length, 0,
                             &dist, &dummy_length);
      assert(!(dummy_length != length && length > 2 && dummy_length > 2));
      ZopfliVerifyLenDist(in, inend, pos, dist, length);
      ZopfliStoreLitLenDist(length, dist, pos, store);
      total_length_test += length;
    } else {
      length = 1;
      ZopfliStoreLitLenDist(in[pos], 0, pos, store);
      total_length_test++;
    }


    assert(pos + length <= inend);
    for (j = 1; j < length; j++) {
      ZopfliUpdateHash(in, pos + j, inend, h);
    }

    pos += length;
  }
}